

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O0

void R_InitSprites(void)

{
  PClassPlayerPawn *type_00;
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  FPlayerSkin *pFVar7;
  FPlayerClass *pFVar8;
  AActor *pAVar9;
  char *pcVar10;
  spritedef_t *psVar11;
  FPlayerSkin *local_70;
  uint local_44;
  FString local_40;
  FString classface;
  PClassPlayerPawn *basetype;
  PClassPlayerPawn *type;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  int lastlump;
  int lump;
  
  if (gameinfo.gametype == GAME_DoomChex) {
    R_CreateSkinTranslation("SPALHTIC");
  }
  else {
    R_CreateSkinTranslation("SPALDOOM");
  }
  uVar4 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
  numskins = (size_t)uVar4;
  j = 0;
  while (i = FWadCollection::FindLump(&Wads,"S_SKIN",(int *)&j,true), i != 0xffffffff) {
    numskins = numskins + 1;
  }
  if ((skins != (FPlayerSkin *)0x0) && (skins != (FPlayerSkin *)0x0)) {
    operator_delete__(skins);
  }
  sVar2 = numskins;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = numskins;
  uVar6 = SUB168(auVar1 * ZEXT816(0x40),0);
  if (SUB168(auVar1 * ZEXT816(0x40),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pFVar7 = (FPlayerSkin *)operator_new__(uVar6);
  if (sVar2 != 0) {
    local_70 = pFVar7;
    do {
      FPlayerSkin::FPlayerSkin(local_70);
      local_70 = local_70 + 1;
    } while (local_70 != pFVar7 + sVar2);
  }
  skins = pFVar7;
  memset(pFVar7,0,numskins << 6);
  for (local_14 = 0; local_14 < numskins; local_14 = local_14 + 1) {
    pFVar8 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,0);
    type_00 = pFVar8->Type;
    skins[local_14].range0start = *(BYTE *)(type_00->Slot + 0x10);
    skins[local_14].range0end = *(BYTE *)((long)(type_00->Slot + 0x10) + 1);
    pAVar9 = GetDefaultByType((PClass *)type_00);
    TVector2<double>::operator=(&skins[local_14].Scale,&pAVar9->Scale);
  }
  R_InitSpriteDefs();
  R_InitVoxels();
  NumStdSprites = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  R_InitSkins();
  local_14 = 0;
  do {
    uVar4 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
    if (uVar4 <= local_14) {
      return;
    }
    pFVar8 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(ulong)local_14);
    classface.Chars = (char *)pFVar8->Type;
    FString::FString(&local_40,&((PClassPlayerPawn *)classface.Chars)->Face);
    strcpy(skins[local_14].name,"Base");
    bVar3 = FString::IsEmpty(&local_40);
    if (bVar3) {
LAB_0074741d:
      skins[local_14].face[0] = 'S';
      skins[local_14].face[1] = 'T';
      skins[local_14].face[2] = 'F';
      skins[local_14].face[3] = '\0';
    }
    else {
      pcVar10 = FString::operator_cast_to_char_(&local_40);
      iVar5 = strcmp(pcVar10,"None");
      if (iVar5 == 0) goto LAB_0074741d;
      pFVar7 = skins + local_14;
      pcVar10 = FString::operator_cast_to_char_(&local_40);
      strcpy(pFVar7->face,pcVar10);
    }
    skins[local_14].range0start = classface.Chars[0x290];
    skins[local_14].range0end = classface.Chars[0x291];
    pAVar9 = GetDefaultByType((PClass *)classface.Chars);
    TVector2<double>::operator=(&skins[local_14].Scale,&pAVar9->Scale);
    pAVar9 = GetDefaultByType((PClass *)classface.Chars);
    skins[local_14].sprite = pAVar9->SpawnState->sprite;
    skins[local_14].namespc = 0;
    pFVar8 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(ulong)local_14);
    local_44 = local_14;
    TArray<int,_int>::Push(&pFVar8->Skins,(int *)&local_44);
    psVar11 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)skins[local_14].sprite);
    if ((psVar11->field_0).dwName == 0x59414c50) {
      for (local_18 = 0; uVar4 = TArray<spritedef_t,_spritedef_t>::Size(&sprites), local_18 < uVar4;
          local_18 = local_18 + 1) {
        psVar11 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(ulong)local_18);
        if ((psVar11->field_0).dwName == deh.PlayerSprite._0_4_) {
          skins[local_14].sprite = local_18;
          break;
        }
      }
    }
    FString::~FString(&local_40);
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void R_InitSprites ()
{
	int lump, lastlump;
	unsigned int i, j;

	// [RH] Create a standard translation to map skins between Heretic and Doom
	if (gameinfo.gametype == GAME_DoomChex)
	{
		R_CreateSkinTranslation ("SPALHTIC");
	}
	else
	{
		R_CreateSkinTranslation ("SPALDOOM");
	}

	// [RH] Count the number of skins.
	numskins = PlayerClasses.Size ();
	lastlump = 0;
	while ((lump = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		numskins++;
	}

	// [RH] Do some preliminary setup
	if (skins != NULL) delete [] skins;
	skins = new FPlayerSkin[numskins];
	memset (skins, 0, sizeof(*skins) * numskins);
	for (i = 0; i < numskins; i++)
	{ // Assume Doom skin by default
		PClassPlayerPawn *type = PlayerClasses[0].Type;
		skins[i].range0start = type->ColorRangeStart;
		skins[i].range0end = type->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (type)->Scale;
	}

	R_InitSpriteDefs ();
	R_InitVoxels();		// [RH] Parse VOXELDEF
	NumStdSprites = sprites.Size();
	R_InitSkins ();		// [RH] Finish loading skin data

	// [RH] Set up base skin
	// [GRB] Each player class has its own base skin
	for (i = 0; i < PlayerClasses.Size (); i++)
	{
		PClassPlayerPawn *basetype = PlayerClasses[i].Type;
		FString classface = basetype->Face;

		strcpy (skins[i].name, "Base");
		if (classface.IsEmpty() || strcmp(classface, "None") == 0)
		{
			skins[i].face[0] = 'S';
			skins[i].face[1] = 'T';
			skins[i].face[2] = 'F';
			skins[i].face[3] = '\0';
		}
		else
		{
			strcpy(skins[i].face, classface);
		}
		skins[i].range0start = basetype->ColorRangeStart;
		skins[i].range0end = basetype->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (basetype)->Scale;
		skins[i].sprite = GetDefaultByType (basetype)->SpawnState->sprite;
		skins[i].namespc = ns_global;

		PlayerClasses[i].Skins.Push (i);

		if (memcmp (sprites[skins[i].sprite].name, "PLAY", 4) == 0)
		{
			for (j = 0; j < sprites.Size (); j++)
			{
				if (memcmp (sprites[j].name, deh.PlayerSprite, 4) == 0)
				{
					skins[i].sprite = (int)j;
					break;
				}
			}
		}
	}

	// [RH] Sort the skins, but leave base as skin 0
	//qsort (&skins[PlayerClasses.Size ()], numskins-PlayerClasses.Size (), sizeof(FPlayerSkin), skinsorter);

}